

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_environment.cpp
# Opt level: O0

void just_test_test_case_f_test_variable_existence(void)

{
  bool bVar1;
  allocator<char> local_1a1;
  string local_1a0;
  assert_msg local_180;
  allocator<char> local_151;
  string local_150;
  assert_msg local_130;
  allocator<char> local_101;
  string local_100;
  allocator<char> local_d9;
  string local_d8;
  assert_msg local_b8;
  allocator<char> local_89;
  string local_88;
  allocator<char> local_51;
  string local_50;
  assert_msg local_30;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/environment/test/test_environment.cpp"
             ,&local_51);
  just::test::assert_msg::assert_msg(&local_30,&local_50,0x59);
  bVar1 = just::environment::exists((string *)(anonymous_namespace)::var_abi_cxx11_);
  just::test::assert_msg::operator()(&local_30,(bool)(~bVar1 & 1));
  just::test::assert_msg::~assert_msg(&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"yes I have",&local_89);
  just::environment::set((string *)(anonymous_namespace)::var_abi_cxx11_,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/environment/test/test_environment.cpp"
             ,&local_d9);
  just::test::assert_msg::assert_msg(&local_b8,&local_d8,0x5b);
  bVar1 = just::environment::exists((string *)(anonymous_namespace)::var_abi_cxx11_);
  just::test::assert_msg::operator()(&local_b8,bVar1);
  just::test::assert_msg::~assert_msg(&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator(&local_d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,"",&local_101);
  just::environment::set((string *)(anonymous_namespace)::var_abi_cxx11_,&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator(&local_101);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_150,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/environment/test/test_environment.cpp"
             ,&local_151);
  just::test::assert_msg::assert_msg(&local_130,&local_150,0x5d);
  bVar1 = just::environment::exists((string *)(anonymous_namespace)::var_abi_cxx11_);
  just::test::assert_msg::operator()(&local_130,bVar1);
  just::test::assert_msg::~assert_msg(&local_130);
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator(&local_151);
  just::environment::remove((anonymous_namespace)::var_abi_cxx11_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/environment/test/test_environment.cpp"
             ,&local_1a1);
  just::test::assert_msg::assert_msg(&local_180,&local_1a0,0x5f);
  bVar1 = just::environment::exists((string *)(anonymous_namespace)::var_abi_cxx11_);
  just::test::assert_msg::operator()(&local_180,(bool)(~bVar1 & 1));
  just::test::assert_msg::~assert_msg(&local_180);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::allocator<char>::~allocator(&local_1a1);
  return;
}

Assistant:

JUST_TEST_CASE(test_variable_existence)
{
  JUST_ASSERT(!environment::exists(var));
  environment::set(var, "yes I have");
  JUST_ASSERT(environment::exists(var));
  environment::set(var, "");
  JUST_ASSERT(environment::exists(var));
  environment::remove(var);
  JUST_ASSERT(!environment::exists(var));
}